

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

void maxHeapsort(HighsInt *heap_v,HighsInt n)

{
  HighsInt HVar1;
  int in_ESI;
  HighsInt *in_RDI;
  HighsInt i;
  HighsInt temp_v;
  int local_14;
  
  for (local_14 = in_ESI; 1 < local_14; local_14 = local_14 + -1) {
    HVar1 = in_RDI[local_14];
    in_RDI[local_14] = in_RDI[1];
    in_RDI[1] = HVar1;
    maxHeapify(in_RDI,1,local_14 + -1);
  }
  return;
}

Assistant:

void maxHeapsort(HighsInt* heap_v, HighsInt n) {
  HighsInt temp_v;
  HighsInt i;
  for (i = n; i >= 2; i--) {
    temp_v = heap_v[i];
    heap_v[i] = heap_v[1];
    heap_v[1] = temp_v;
    maxHeapify(heap_v, 1, i - 1);
  }
}